

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O0

root_type ising::free_energy::
          specific_heat<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>>
                    (fvar<double,_2UL> f,fvar<double,_2UL> beta)

{
  get_type_at<fvar<double,_2UL>,_sizeof___(Orders)> gVar1;
  get_type_at<fvar<double,_2UL>,_sizeof___(Orders)> gVar2;
  get_type_at<fvar<double,_2UL>,_sizeof___(Orders)> gVar3;
  get_type_at<fvar<double,_2UL>,_sizeof___(Orders)> b0;
  get_type_at<fvar<double,_2UL>,_sizeof___(Orders)> f2;
  get_type_at<fvar<double,_2UL>,_sizeof___(Orders)> f1;
  get_type_at<fvar<double,_2UL>,_sizeof___(Orders)> f0;
  int in_stack_ffffffffffffffcc;
  fvar<double,_2UL> *this;
  
  this = (fvar<double,_2UL> *)&stack0x00000008;
  boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::derivative<int>
            (this,in_stack_ffffffffffffffcc);
  gVar1 = boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::derivative<int>
                    (this,in_stack_ffffffffffffffcc);
  gVar2 = boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::derivative<int>
                    (this,in_stack_ffffffffffffffcc);
  gVar3 = boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::derivative<int>
                    (this,in_stack_ffffffffffffffcc);
  return -(gVar3 * gVar3 * (gVar1 + gVar1 + gVar3 * gVar2));
}

Assistant:

inline typename U::root_type specific_heat(U f, U beta) {
  auto f0 = f.derivative(0);
  auto f1 = f.derivative(1);
  auto f2 = f.derivative(2);
  auto b0 = beta.derivative(0);
  return -(b0 * b0 * (2 * f1 + b0 * f2));
}